

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_vector.h
# Opt level: O3

void __thiscall wasm::SortedVector::insert(SortedVector *this,Index x)

{
  uint *puVar1;
  iterator __position;
  pointer puVar2;
  uint *puVar3;
  uint *puVar4;
  ulong uVar5;
  pointer puVar6;
  size_t __n;
  ulong uVar7;
  ulong uVar8;
  uint local_24 [2];
  Index x_local;
  
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar5 = (long)__position._M_current - (long)puVar1 >> 2;
  puVar4 = puVar1;
  uVar8 = uVar5;
  while (puVar3 = puVar4, 0 < (long)uVar8) {
    uVar7 = uVar8 >> 1;
    uVar8 = ~uVar7 + uVar8;
    puVar4 = puVar3 + uVar7 + 1;
    if (x <= puVar3[uVar7]) {
      puVar4 = puVar3;
      uVar8 = uVar7;
    }
  }
  if (puVar3 == __position._M_current) {
    if (__position._M_current ==
        (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,__position,local_24);
    }
    else {
      *__position._M_current = x;
      (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  else if (x < *puVar3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,uVar5 + 1);
    puVar6 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar8 = (ulong)((long)puVar3 - (long)puVar1) >> 2 & 0xffffffff;
    __n = (long)puVar2 + (-4 - (long)(puVar6 + uVar8));
    if (__n != 0) {
      memmove((void *)((long)puVar2 - __n),puVar6 + uVar8,__n);
      puVar6 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    puVar6[uVar8] = x;
  }
  return;
}

Assistant:

void insert(Index x) {
    auto it = std::lower_bound(begin(), end(), x);
    if (it == end()) {
      push_back(x);
    } else if (*it > x) {
      Index i = it - begin();
      resize(size() + 1);
      std::move_backward(begin() + i, begin() + size() - 1, end());
      (*this)[i] = x;
    }
  }